

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O2

socket_t getsock(void)

{
  int __fd;
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  vw_exception *this;
  string local_2c0;
  int on;
  ostream local_290;
  int enableTKA;
  
  __fd = socket(2,1,0);
  if (-1 < __fd) {
    on = 1;
    iVar1 = setsockopt(__fd,1,2,&on,4);
    if (iVar1 < 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"setsockopt SO_REUSEADDR: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    enableTKA = 1;
    iVar1 = setsockopt(__fd,1,9,&enableTKA,4);
    if (iVar1 < 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"setsockopt SO_KEEPALIVE: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    return __fd;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&on);
  poVar2 = &local_290;
  std::operator<<(poVar2,"socket");
  piVar3 = __errno_location();
  pcVar4 = (char *)&enableTKA;
  pcVar5 = strerror_r(*piVar3,pcVar4,0x100);
  if (pcVar5 == (char *)0x0) {
    poVar2 = std::operator<<(poVar2,"errno = ");
  }
  else {
    pcVar4 = "errno = unknown";
  }
  std::operator<<(poVar2,pcVar4);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
             ,0x53,&local_2c0);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

socket_t getsock()
{
  socket_t sock = socket(PF_INET, SOCK_STREAM, 0);
  if (sock < 0)
    THROWERRNO("socket");

    // SO_REUSEADDR will allow port rebinding on Windows, causing multiple instances
    // of VW on the same machine to potentially contact the wrong tree node.
#ifndef _WIN32
  int on = 1;
  if (setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&on, sizeof(on)) < 0)
    cerr << "setsockopt SO_REUSEADDR: " << strerror(errno) << endl;
#endif

  // Enable TCP Keep Alive to prevent socket leaks
  int enableTKA = 1;
  if (setsockopt(sock, SOL_SOCKET, SO_KEEPALIVE, (char*)&enableTKA, sizeof(enableTKA)) < 0)
    cerr << "setsockopt SO_KEEPALIVE: " << strerror(errno) << endl;

  return sock;
}